

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O2

void __thiscall
TileWire::TileWire(TileWire *this,Board *boardPtr,Vector2u *position,bool noAdjacentUpdates,
                  Direction direction,Type type,State state1,State state2)

{
  State SVar1;
  
  SVar1 = LOW;
  Tile::Tile(&this->super_Tile,boardPtr,position,true,true);
  (this->super_Tile)._vptr_Tile = (_func_int **)&PTR__TileWire_001c5058;
  memcpy(&(this->super_Tile).field_0x21,&DAT_00186063,0x140);
  if (type == STRAIGHT) {
    direction = (int)direction % 2;
  }
  else if (0xfffffffd < type + ~CROSSOVER) {
    this->_type = type;
    this->_state1 = state1;
    if (type == CROSSOVER) {
      SVar1 = state2;
    }
    goto LAB_0013791c;
  }
  (this->super_Tile)._direction = direction;
  this->_type = type;
  this->_state1 = state1;
LAB_0013791c:
  this->_state2 = SVar1;
  this->_updateTimestamp1 = 0;
  this->_updateTimestamp2 = 0;
  addUpdate(this,false,noAdjacentUpdates);
  return;
}

Assistant:

TileWire::TileWire(Board* boardPtr, const Vector2u& position, bool noAdjacentUpdates, Direction direction, Type type, State state1, State state2) : Tile(boardPtr, position, true, true) {
    if (type == STRAIGHT) {
        _direction = static_cast<Direction>(direction % 2);
    } else if (type != JUNCTION && type != CROSSOVER) {
        _direction = direction;
    }
    _type = type;
    _state1 = state1;
    if (type == CROSSOVER) {
        _state2 = state2;
    } else {
        _state2 = LOW;
    }
    _updateTimestamp1 = 0;
    _updateTimestamp2 = 0;
    addUpdate(false, noAdjacentUpdates);
}